

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O2

void vociren(voccxdef *ctx,objnum oldnum,objnum newnum)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  vocdef *pvVar4;
  undefined6 in_register_00000012;
  uint *puVar5;
  ulong uVar6;
  int iVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  ulong uVar9;
  vocdef *pvVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar6 = CONCAT62(in_register_00000032,oldnum) & 0xffffffff;
  vocialo(ctx,newnum);
  uVar2 = uVar6 >> 8;
  uVar8 = (ulong)(((uint)CONCAT62(in_register_00000032,oldnum) & 0xff) << 3);
  uVar9 = CONCAT62(in_register_00000012,newnum) >> 8 & 0xffffff;
  uVar11 = (ulong)(((uint)CONCAT62(in_register_00000012,newnum) & 0xff) << 3);
  *(undefined8 *)((long)ctx->voccxinh[uVar9] + uVar11) =
       *(undefined8 *)((long)ctx->voccxinh[uVar2] + uVar8);
  *(undefined8 *)((long)ctx->voccxinh[uVar2] + uVar8) = 0;
  pbVar1 = (byte *)(*(long *)((long)ctx->voccxinh[uVar9] + uVar11) + 8);
  *pbVar1 = *pbVar1 | 1;
  pvVar4 = (vocdef *)ctx->voccxhsh;
  iVar7 = 0x100;
  while (bVar12 = iVar7 != 0, iVar7 = iVar7 + -1, pvVar10 = pvVar4, bVar12) {
    while (pvVar10 = pvVar10->vocnxt, pvVar10 != (vocdef *)0x0) {
      uVar3 = pvVar10->vocwlst;
      if (uVar3 != 0xffffffff) goto LAB_0011971c;
      puVar5 = (uint *)0x0;
      while (puVar5 != (uint *)0x0) {
        if ((short)puVar5[1] == (short)uVar6) {
          *(objnum *)(puVar5 + 1) = newnum;
          *(byte *)((long)puVar5 + 7) = *(byte *)((long)puVar5 + 7) | 1;
        }
        uVar3 = *puVar5;
        puVar5 = (uint *)0x0;
        if (uVar3 != 0xffffffff) {
LAB_0011971c:
          puVar5 = (uint *)((long)&ctx->voccxwp[(ulong)uVar3 / 2000]->vocwnxt +
                           (ulong)(uVar3 % 2000 << 3));
        }
      }
    }
    pvVar4 = (vocdef *)&pvVar4->voclen;
  }
  return;
}

Assistant:

void vociren(voccxdef *ctx, objnum oldnum, objnum newnum)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;


    /* make sure we have a page table entry for the original object */
    vocialo(ctx, newnum);

    /* move the old object's inheritance record to the new slot */
    vocinh(ctx, newnum) = vocinh(ctx, oldnum);
    vocinh(ctx, oldnum) = 0;

    /* make the old object an honorary class object */
    vocinh(ctx, newnum)->vociflg |= VOCIFCLASS;

    /* 
     *   Renumber any vocabulary associated with the old object to the new
     *   object.
     */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i != 0 ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v != 0 ; v = v->vocnxt)
        {
            /* go through all vocwdef's defined for this word */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                /* 
                 *   renumber this word and mark it as being associated
                 *   with a class if it's associated with the original
                 *   object 
                 */
                if (vw->vocwobj == oldnum)
                {
                    vw->vocwobj = newnum;
                    vw->vocwflg |= VOCFCLASS;
                }
            }
        }
    }
}